

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

bool __thiscall polyscope::render::ManagedBuffer<float>::hasData(ManagedBuffer<float> *this)

{
  bool bVar1;
  long in_RDI;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    if ((*(int *)(in_RDI + 0x90) == 0) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x70)), bVar1)) {
      local_1 = true;
    }
    else if ((*(int *)(in_RDI + 0x90) == 1) &&
            (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x80)),
            bVar1)) {
      local_1 = true;
    }
    else if ((*(int *)(in_RDI + 0x90) == 2) &&
            (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x80)),
            bVar1)) {
      local_1 = true;
    }
    else if ((*(int *)(in_RDI + 0x90) == 3) &&
            (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x80)),
            bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ManagedBuffer<T>::hasData() {

  if (hostBufferIsPopulated) return true;
  if (deviceBufferType == DeviceBufferType::Attribute && renderAttributeBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture1d && renderTextureBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture2d && renderTextureBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture3d && renderTextureBuffer) return true;
  return false;
}